

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<DataStream,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  unsigned_long *__n;
  unsigned_long *puVar1;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  size_t allocated;
  DefaultFormatter formatter;
  size_t size;
  bool in_stack_00000047;
  DataStream *in_stack_00000048;
  DataStream *in_stack_ffffffffffffffb8;
  unsigned_long *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  
  this_00 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffb8);
  __n = (unsigned_long *)ReadCompactSize<DataStream>(in_stack_00000048,in_stack_00000047);
  puVar2 = (unsigned_long *)0x0;
  while (puVar2 < __n) {
    puVar2 = std::min<unsigned_long>(puVar2,(unsigned_long *)in_stack_ffffffffffffffb8);
    puVar2 = (unsigned_long *)*puVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,(size_type)__n);
    while (puVar1 = (unsigned_long *)
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               in_stack_ffffffffffffffb8), puVar1 < puVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<>
                (in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffb8 = in_RSI;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI);
      DefaultFormatter::Unser<DataStream,unsigned_int>(in_stack_ffffffffffffffb8,(uint *)0x17923d8);
    }
  }
  if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }